

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-all.c
# Opt level: O0

void build_page_bitmap(uc_struct_conflict15 *uc,PageDesc *p)

{
  ulong uVar1;
  uint uVar2;
  unsigned_long *puVar3;
  uint *local_30;
  TranslationBlock_conflict *tb;
  uint local_20;
  int tb_end;
  int tb_start;
  int n;
  PageDesc *p_local;
  uc_struct_conflict15 *uc_local;
  
  puVar3 = bitmap_new(0x4000);
  p->code_bitmap = puVar3;
  uVar2 = (uint)p->first_tb;
  uVar1 = p->first_tb;
  while( true ) {
    tb_end = uVar2 & 1;
    local_30 = (uint *)(uVar1 & 0xfffffffffffffffe);
    if (local_30 == (uint *)0x0) break;
    if (tb_end == 0) {
      local_20 = *local_30 & 0x3fff;
      tb._4_4_ = local_20 + (ushort)local_30[3];
      if (0x4000 < tb._4_4_) {
        tb._4_4_ = 0x4000;
      }
    }
    else {
      local_20 = 0;
      tb._4_4_ = *local_30 + (uint)(ushort)local_30[3] & 0x3fff;
    }
    qemu_bitmap_set(p->code_bitmap,(long)(int)local_20,(long)(int)(tb._4_4_ - local_20));
    uVar1 = *(ulong *)(local_30 + (long)tb_end * 2 + 0xc);
    uVar2 = (uint)uVar1;
  }
  return;
}

Assistant:

static void build_page_bitmap(struct uc_struct *uc, PageDesc *p)
{
    int n, tb_start, tb_end;
    TranslationBlock *tb;

    assert_page_locked(p);
    p->code_bitmap = bitmap_new(TARGET_PAGE_SIZE);

    PAGE_FOR_EACH_TB(p, tb, n) {
        /* NOTE: this is subtle as a TB may span two physical pages */
        if (n == 0) {
            /* NOTE: tb_end may be after the end of the page, but
               it is not a problem */
            tb_start = tb->pc & ~TARGET_PAGE_MASK;
            tb_end = tb_start + tb->size;
            if (tb_end > TARGET_PAGE_SIZE) {
                tb_end = TARGET_PAGE_SIZE;
             }
        } else {
            tb_start = 0;
            tb_end = ((tb->pc + tb->size) & ~TARGET_PAGE_MASK);
        }
        qemu_bitmap_set(p->code_bitmap, tb_start, tb_end - tb_start);
    }
}